

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O1

void __thiscall webrtc::WavReader::WavReader(WavReader *this,string *filename)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  string *result;
  int line;
  WavFormat format;
  size_t bytes_per_sample;
  ReadableWavFile readable;
  WavFormat local_324;
  size_t local_320;
  ReadableWav local_318;
  FILE *local_310;
  FatalMessage local_308;
  FatalMessage local_190;
  
  (this->super_WavFile)._vptr_WavFile = (_func_int **)&PTR__WavReader_001cfcf0;
  pFVar2 = fopen((filename->_M_dataplus)._M_p,"rb");
  this->file_handle_ = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    local_310 = this->file_handle_;
    local_318._vptr_ReadableWav = (_func_int **)&PTR_Read_001cfda0;
    bVar1 = ReadWavHeader(&local_318,&this->num_channels_,&this->sample_rate_,&local_324,&local_320,
                          &this->num_samples_);
    if (!bVar1) {
      rtc::FatalMessage::FatalMessage
                (&local_308,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_308,
                 "Check failed: ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format, &bytes_per_sample, &num_samples_)"
                 ,0x70);
      std::ios::widen((char)(ostream *)&local_308 + (char)*(undefined8 *)(local_308._0_8_ + -0x18));
      std::ostream::put((char)&local_308);
      poVar3 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
      if (!bVar1) goto LAB_0014ee97;
    }
    this->num_samples_remaining_ = this->num_samples_;
    if (local_324 == kWavFormatPcm) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<webrtc::WavFormat,webrtc::WavFormat>
                         (&kWavFormat,&local_324,"kWavFormat == format");
    }
    if (result == (string *)0x0) {
      if (local_320 == 2) {
        result = (string *)0x0;
      }
      else {
        result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                           (&kBytesPerSample,&local_320,"kBytesPerSample == bytes_per_sample");
      }
      if (result == (string *)0x0) {
        return;
      }
      line = 0x3c;
    }
    else {
      line = 0x3b;
    }
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,line,result);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  rtc::FatalMessage::FatalMessage
            (&local_308,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_308,"Check failed: file_handle_",0x1a);
  std::ios::widen((char)(ostream *)&local_308 + (char)*(undefined8 *)(local_308._0_8_ + -0x18));
  std::ostream::put((char)&local_308);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Could not open wav file for reading.",0x24);
LAB_0014ee97:
  rtc::FatalMessage::~FatalMessage(&local_308);
}

Assistant:

WavReader::WavReader(const std::string& filename)
    : file_handle_(fopen(filename.c_str(), "rb")) {
  RTC_CHECK(file_handle_) << "Could not open wav file for reading.";

  ReadableWavFile readable(file_handle_);
  WavFormat format;
  size_t bytes_per_sample;
  RTC_CHECK(ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format,
                          &bytes_per_sample, &num_samples_));
  num_samples_remaining_ = num_samples_;
  RTC_CHECK_EQ(kWavFormat, format);
  RTC_CHECK_EQ(kBytesPerSample, bytes_per_sample);
}